

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# san.c
# Opt level: O2

move_t SAN_parse_move(chess_state_t *state,char *san)

{
  uint *puVar1;
  char cVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  size_t sVar8;
  char *pcVar9;
  char *pcVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  byte bVar15;
  byte bVar16;
  uint uVar17;
  char *s;
  bool bVar18;
  move_t moves [256];
  
  sVar8 = strlen(san);
  uVar7 = (uint)sVar8;
  uVar4 = STATE_generate_moves_simple(state,moves);
  cVar2 = *san;
  bVar16 = 1;
  switch(cVar2) {
  case 'K':
  case 'O':
    iVar5 = strncmp(san,"O-O-O",5);
    if (iVar5 == 0) {
      uVar13 = 0;
      uVar14 = (ulong)uVar4;
      if ((int)uVar4 < 1) {
        uVar14 = uVar13;
      }
      do {
        if (uVar14 == uVar13) {
          return 0;
        }
        puVar1 = moves + uVar13;
        uVar13 = uVar13 + 1;
      } while ((*puVar1 & 0x3c0000) != 0xc0000);
      return *puVar1;
    }
    uVar12 = 5;
    if ((cVar2 == 'O') && (san[1] == '-')) {
      uVar14 = 0;
      if (san[2] == 'O') {
        uVar13 = (ulong)uVar4;
        if ((int)uVar4 < 1) {
          uVar13 = uVar14;
        }
        do {
          if (uVar13 == uVar14) {
            return 0;
          }
          puVar1 = moves + uVar14;
          uVar14 = uVar14 + 1;
        } while ((*puVar1 & 0x3c0000) != 0x80000);
        return *puVar1;
      }
      goto LAB_00104853;
    }
    break;
  case 'L':
  case 'M':
  case 'P':
switchD_001047d5_caseD_4c:
    uVar14 = 1;
    uVar12 = 0;
    bVar16 = 0;
    goto LAB_00104853;
  case 'N':
    uVar12 = 1;
    break;
  case 'Q':
    uVar12 = 4;
    break;
  case 'R':
    uVar12 = 3;
    break;
  default:
    if (cVar2 != 'B') goto switchD_001047d5_caseD_4c;
    uVar12 = 2;
  }
  uVar14 = 0;
LAB_00104853:
  pcVar9 = strchr(san,0x78);
  bVar15 = (byte)uVar14;
  uVar17 = uVar7;
  if ((5 < (int)uVar7 & bVar15 & pcVar9 != (char *)0x0) == 1) {
    iVar5 = strcmp(san + ((ulong)(uVar7 & 0x7fffffff) - 5)," e.p.");
    uVar17 = uVar7 - 5;
    if (iVar5 != 0) {
      uVar17 = uVar7;
    }
  }
  if (san[(long)(int)uVar17 + -1] == '+') {
    uVar17 = uVar17 - 1;
  }
  if (san[(long)(int)uVar17 + -1] == '#') {
    uVar17 = uVar17 - 1;
  }
  uVar7 = 0;
  if ((bVar15 != 0) && (pcVar10 = strchr(san,0x3d), uVar7 = 0, pcVar10 != (char *)0x0)) {
    cVar2 = san[(long)(int)uVar17 + -1];
    if (cVar2 == 'R') {
      uVar7 = 3;
    }
    else if (cVar2 == 'N') {
      uVar7 = 1;
    }
    else if (cVar2 == 'Q') {
      uVar7 = 4;
    }
    else {
      if (cVar2 != 'B') {
        return 0;
      }
      uVar7 = 2;
    }
    uVar17 = uVar17 - 2;
  }
  iVar5 = uVar17 - 2;
  if (pcVar9 != (char *)0x0) {
    iVar5 = uVar17 - 3;
  }
  if ((byte)(bVar16 & 1 < iVar5 | 0 < iVar5 & bVar15) == 1) {
    uVar6 = 0xffffffff;
    uVar11 = 0xffffffff;
    for (uVar14 = 0; iVar5 - (uint)(bVar15 ^ 1) != uVar14; uVar14 = uVar14 + 1) {
      bVar16 = san[uVar14 + (bVar15 ^ 1)] + 0x9f;
      if (bVar16 < 8) {
        uVar11 = (uint)bVar16;
      }
      else {
        bVar16 = san[uVar14 + (bVar15 ^ 1)] - 0x31;
        if (bVar16 < 8) {
          uVar6 = (uint)bVar16;
        }
      }
    }
  }
  else {
    uVar6 = 0xffffffff;
    uVar11 = uVar6;
  }
  uVar13 = 0;
  uVar14 = (ulong)uVar4;
  if ((int)uVar4 < 1) {
    uVar14 = uVar13;
  }
  iVar5 = 0;
  uVar4 = 0;
  for (; uVar14 != uVar13; uVar13 = uVar13 + 1) {
    uVar3 = moves[uVar13];
    if ((((((uVar3 >> 0xc & 7) == uVar12) && ((pcVar9 != (char *)0x0) != ((uVar3 >> 0x14 & 1) == 0))
          ) && ((uVar7 == 0 || (uVar7 == ((uVar3 >> 0x12 & 0xb) - 7 & (int)(uVar3 << 10) >> 0x1f))))
         ) && ((uVar3 >> 6 & 0x3f) ==
               ((int)san[(long)(int)uVar17 + -2] + san[(long)(int)uVar17 + -1] * 8) - 0x1e9U)) &&
       ((((int)uVar6 < 0 || ((uVar3 >> 3 & 7) == uVar6)) &&
        (bVar18 = (uVar3 & 7) == uVar11, iVar5 = iVar5 + (uint)(bVar18 || (int)uVar11 < 0),
        bVar18 || (int)uVar11 < 0)))) {
      uVar4 = uVar3;
    }
  }
  uVar7 = 0;
  if (iVar5 == 1) {
    uVar7 = uVar4;
  }
  return uVar7;
}

Assistant:

move_t SAN_parse_move(const chess_state_t *state, const char *san)
{
    move_t moves[256];
    move_t candidate = 0;
    move_t num_candidates = 0;
    int num_moves;
    int i;
    int len;
    int is_capture = 0;
    int promotion_type = 0;
    int type = PAWN;
    int pos_to = 0;
    int rank = -1;
    int file = -1;
    
    len = (int)strlen(san);
    
    /* Generate all possible moves */
    num_moves = STATE_generate_moves_simple(state, moves);
    
    /* What type of piece is moving? */
    switch(san[0]) {
    case 'N':
        type = KNIGHT;
        break;
    case 'B':
        type = BISHOP;
        break;
    case 'R':
        type = ROOK;
        break;
    case 'Q':
        type = QUEEN;
        break;
    case 'K':
    case 'O':
        type = KING;
        break;
    default:
        type = PAWN;
        break;
    }
    
    if(type == KING) {
        /* Is this a kingside castling? */
        if(strncmp(san, "O-O-O", 5) == 0) {
            for(i = 0; i < num_moves; i++) {
                if(MOVE_GET_SPECIAL_FLAGS(moves[i]) == MOVE_QUEEN_CASTLE) {
                    return moves[i];
                }
            }
            /* Failure */
            return 0;
        }
        
        /* Is this a queenside castling? */
        if(strncmp(san, "O-O", 3) == 0) {
            for(i = 0; i < num_moves; i++) {
                if(MOVE_GET_SPECIAL_FLAGS(moves[i]) == MOVE_KING_CASTLE) {
                    return moves[i];
                }
            }
            /* Failure */
            return 0;
        }
    }
    
    /* Is this move a capture? */
    is_capture = (strchr(san, 'x') != 0);
    
    /* Is this move an en passant capture? */
    if(type == PAWN && is_capture && len > 5) {
        if(strcmp(san+len-5, " e.p.") == 0) {
            len -= 5;
        }
    }
    
    /* Is this move a check? */
    if(san[len-1] == '+') {
        len -= 1;
    }

    /* Is this move a check mate? */
    if(san[len-1] == '#') {
        len -= 1;
    }
    
    /* Is this move a pawn promotion? */
    if(type == PAWN && strchr(san, '=')) {
        /* To what piece? */
        switch(san[len-1]) {
        case 'N':
            promotion_type = KNIGHT;
            break;
        case 'B':
            promotion_type = BISHOP;
            break;
        case 'R':
            promotion_type = ROOK;
            break;
        case 'Q':
            promotion_type = QUEEN;
            break;
        default:
        /* Failure */
            return 0;
        }
        
        len -= 2;
    }
    
    /* To what square is the piece moving? */
    pos_to = (san[len-2]-'a') + (san[len-1]-'1') * 8;
    len -= 2;
    
    if(is_capture) {
        len -= 1;
    }
    
    /* Check from file/rank/square */
    if((type == PAWN && len > 0 ) || (type != PAWN && len > 1)) {
        const char *s = san;
        if(type != PAWN) {
            s += 1;
            len -= 1;
        }
        
        for(i = 0; i < len; i++) {
            if(s[i] >= 'a' && s[i] <= 'h') {
                file = s[i] - 'a';
            } else if(s[i] >= '1' && s[i] <= '8') {
                rank = s[i] - '1';
            }
        }
    }

    /* Find candidate move */
    for(i = 0; i < num_moves; i++) {
        int pos_from;
        move_t move = moves[i];
        
        if(MOVE_GET_TYPE(move) != type) continue;
        if((MOVE_IS_CAPTURE(move) != 0) != is_capture) continue;
        if(promotion_type && promotion_type != MOVE_PROMOTION_TYPE(move)) continue;
        if(MOVE_GET_POS_TO(move) != pos_to) continue;
        pos_from = MOVE_GET_POS_FROM(move);
        if(rank >= 0 && pos_from / 8 != rank) continue;
        if(file >= 0 && pos_from % 8 != file) continue;

        num_candidates++;
        candidate = move;
    }

    if(num_candidates == 1) {
        return candidate;
    } else {
        /* Failure */
        return 0;
    }
}